

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cc
# Opt level: O0

void __thiscall pstack::Procman::Process::processAUXV(Process *this,Reader *auxio)

{
  Context *__args_1;
  bool bVar1;
  value_type *pvVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *reader;
  Ehdr *pEVar5;
  ostream *poVar6;
  char *pcVar7;
  void *pvVar8;
  Exception *ex_1;
  string local_500 [8];
  string exeName;
  exception *ex;
  allocator<char> local_4b1;
  string local_4b0 [32];
  shared_ptr<const_pstack::Reader> local_490;
  undefined1 local_480 [8];
  shared_ptr<pstack::Elf::Object> elf;
  Addr hdr;
  value_type *aux;
  undefined1 auStack_458 [7];
  sentinel __end2;
  iterator __begin2;
  ReaderArray<Elf64_auxv_t,_64UL> *__range2;
  Reader *auxio_local;
  Process *this_local;
  
  ReaderArray<Elf64_auxv_t,_64UL>::ReaderArray
            ((ReaderArray<Elf64_auxv_t,_64UL> *)&__begin2.idx,auxio,0);
  _auStack_458 = ReaderArray<Elf64_auxv_t,_64UL>::begin
                           ((ReaderArray<Elf64_auxv_t,_64UL> *)&__begin2.idx);
  ReaderArray<Elf64_auxv_t,_64UL>::end((ReaderArray<Elf64_auxv_t,_64UL> *)&__begin2.idx);
  while (bVar1 = ReaderArray<Elf64_auxv_t,_64UL>::iterator::operator!=
                           ((iterator *)auStack_458,(sentinel *)((long)&aux + 7)), bVar1) {
    pvVar2 = ReaderArray<Elf64_auxv_t,_64UL>::iterator::operator*((iterator *)auStack_458);
    elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&pvVar2->a_un;
    switch(pvVar2->a_type) {
    case 0:
      return;
    default:
      if (2 < *(int *)(this->context + 0xa0)) {
        poVar6 = std::operator<<(*(ostream **)(this->context + 0x78),"auxv: ");
        pcVar7 = auxtype2str((int)pvVar2->a_type);
        poVar6 = std::operator<<(poVar6,pcVar7);
        poVar6 = std::operator<<(poVar6,": ");
        pvVar8 = (void *)std::ostream::operator<<
                                   (poVar6,(ulong)elf.
                                                  super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      }
      break;
    case 7:
      if (2 < *(int *)(this->context + 0xa0)) {
        poVar6 = std::operator<<(*(ostream **)(this->context + 0x78),"auxv: AT_BASE=");
        pvVar8 = (void *)std::ostream::operator<<
                                   (poVar6,(ulong)elf.
                                                  super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      }
      this->interpBase =
           (Addr)elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
      break;
    case 9:
      if (2 < *(int *)(this->context + 0xa0)) {
        poVar6 = std::operator<<(*(ostream **)(this->context + 0x78),"auxv: AT_ENTRY=");
        pvVar8 = (void *)std::ostream::operator<<
                                   (poVar6,(ulong)elf.
                                                  super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      }
      this->entry = (Addr)elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
      break;
    case 0x1f:
      if (2 < *(int *)(this->context + 0xa0)) {
        poVar6 = std::operator<<(*(ostream **)(this->context + 0x78),"auxv: AT_EXECFN=");
        pvVar8 = (void *)std::ostream::operator<<
                                   (poVar6,(ulong)elf.
                                                  super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      }
      peVar3 = std::__shared_ptr_access<pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->io);
      (**(code **)(*(long *)peVar3 + 0x38))
                (local_500,peVar3,
                 elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
      if (1 < *(int *)(this->context + 0xa0)) {
        poVar6 = std::operator<<(*(ostream **)(this->context + 0x78),"filename from auxv: ");
        poVar6 = std::operator<<(poVar6,local_500);
        std::operator<<(poVar6,"\n");
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->execImage);
      if (!bVar1) {
        pstack::Context::getImageForName((string *)&ex_1,SUB81(this->context,0));
        std::shared_ptr<pstack::Elf::Object>::operator=
                  (&this->execImage,(shared_ptr<pstack::Elf::Object> *)&ex_1);
        std::shared_ptr<pstack::Elf::Object>::~shared_ptr((shared_ptr<pstack::Elf::Object> *)&ex_1);
        if (this->entry == 0) {
          peVar4 = std::
                   __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->execImage);
          pEVar5 = Elf::Object::getHeader(peVar4);
          this->entry = pEVar5->e_entry;
        }
      }
      std::__cxx11::string::~string(local_500);
      break;
    case 0x20:
      if (2 < *(int *)(this->context + 0xa0)) {
        poVar6 = std::operator<<(*(ostream **)(this->context + 0x78),"auxv:AT_SYSINFO=");
        pvVar8 = (void *)std::ostream::operator<<
                                   (poVar6,(ulong)elf.
                                                  super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
      }
      this->sysent = (Addr)elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
      break;
    case 0x21:
      __args_1 = this->context;
      peVar3 = std::__shared_ptr_access<pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->io);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_4b0,"(vdso image)",&local_4b1);
      (**(code **)(*(long *)peVar3 + 0x48))
                (&local_490,peVar3,local_4b0,
                 elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi,0x10000);
      std::make_shared<pstack::Elf::Object,pstack::Context&,std::shared_ptr<pstack::Reader_const>>
                ((Context *)local_480,(shared_ptr<const_pstack::Reader> *)__args_1);
      std::shared_ptr<const_pstack::Reader>::~shared_ptr(&local_490);
      std::__cxx11::string::~string(local_4b0);
      std::allocator<char>::~allocator(&local_4b1);
      this->vdsoBase =
           (Addr)elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&ex,"(vdso image)");
      addElfObject(this,_ex,(sptr *)local_480,
                   (Addr)elf.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
      std::shared_ptr<pstack::Elf::Object>::operator=
                (&this->vdsoImage,(shared_ptr<pstack::Elf::Object> *)local_480);
      if (1 < *(int *)(this->context + 0xa0)) {
        poVar6 = std::operator<<(*(ostream **)(this->context + 0x78),"auxv: VDSO ");
        peVar4 = std::
                 __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_480);
        reader = std::
                 __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)(peVar4 + 0x40));
        poVar6 = pstack::operator<<(poVar6,reader);
        poVar6 = std::operator<<(poVar6," loaded at ");
        pvVar8 = (void *)std::ostream::operator<<(poVar6,std::hex);
        pvVar8 = (void *)std::ostream::operator<<
                                   (pvVar8,(ulong)elf.
                                                  super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi);
        poVar6 = (ostream *)std::ostream::operator<<(pvVar8,std::dec);
        std::operator<<(poVar6,"\n");
      }
      std::shared_ptr<pstack::Elf::Object>::~shared_ptr
                ((shared_ptr<pstack::Elf::Object> *)local_480);
    }
    ReaderArray<Elf64_auxv_t,_64UL>::iterator::operator++((iterator *)auStack_458);
  }
  return;
}

Assistant:

void
Process::processAUXV(const Reader &auxio)
{
    for (auto &aux : ReaderArray<Elf::auxv_t>(auxio)) {
        Elf::Addr hdr = aux.a_un.a_val;
        switch (aux.a_type) {
            case AT_NULL: // Indicates end of the AUXV vector.
                return;
            case AT_ENTRY: {
                if (context.verbose > 2)
                    *context.debug << "auxv: AT_ENTRY=" << hdr << std::endl;
                // this provides a reference for relocating the executable when
                // compared to the entrypoint there.
                entry = hdr;
                break;
            }
            case AT_SYSINFO: {
                if (context.verbose > 2)
                    *context.debug << "auxv:AT_SYSINFO=" << hdr << std::endl;
                sysent = hdr;
                break;
            }
            case AT_SYSINFO_EHDR: {
                try {
                    auto elf = std::make_shared<Elf::Object>(context, io->view("(vdso image)", hdr, 65536));
                    vdsoBase = hdr;
                    addElfObject("(vdso image)", elf, hdr);
                    vdsoImage = elf;
                    if (context.verbose >= 2) {
                        *context.debug << "auxv: VDSO " << *elf->io
                            << " loaded at " << std::hex << hdr << std::dec << "\n";
                    }

                }
                catch (const std::exception &ex) {
                    if (context.debug)
                        *context.debug << "auxv: warning: failed to load DSO: " << ex.what() << "\n";
                }
                break;
            }
            case AT_BASE:
                if (context.verbose > 2)
                    *context.debug << "auxv: AT_BASE=" << hdr << std::endl;
                interpBase = hdr;
                break;
#ifdef AT_EXECFN
            case AT_EXECFN: {
                if (context.verbose > 2)
                    *context.debug << "auxv: AT_EXECFN=" << hdr << std::endl;
                try {
                    auto exeName = io->readString(hdr);
                    if (context.verbose >= 2)
                        *context.debug << "filename from auxv: " << exeName << "\n";
                    if (!execImage) {
                        execImage = context.getImageForName(exeName);
                        if (entry == 0)
                            entry = execImage->getHeader().e_entry;
                    }
                }
                catch (const Exception &ex) {
                    *context.debug << "failed to read AT_EXECFN: " << ex.what() << std::endl;
                }

                break;
            }
#endif
            default:
                if (context.verbose > 2)
                    *context.debug << "auxv: " << auxtype2str( aux.a_type) << ": " << hdr << std::endl;
        }
    }
}